

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void OnSetComponentLifecycle(ecs_iter_t *it)

{
  ecs_world_t *world_00;
  void *pvVar1;
  ecs_entity_t e;
  int i;
  ecs_world_t *world;
  EcsComponentLifecycle *cl;
  ecs_iter_t *it_local;
  
  pvVar1 = ecs_column_w_size(it,0x28,1);
  world_00 = it->world;
  for (e._4_4_ = 0; e._4_4_ < it->count; e._4_4_ = e._4_4_ + 1) {
    ecs_set_component_actions_w_entity
              (world_00,it->entities[e._4_4_],
               (EcsComponentLifecycle *)((long)pvVar1 + (long)e._4_4_ * 0x28));
  }
  return;
}

Assistant:

static
void OnSetComponentLifecycle(
    ecs_iter_t *it)
{
    EcsComponentLifecycle *cl = ecs_column(it, EcsComponentLifecycle, 1);
    ecs_world_t *world = it->world;

    int i;
    for (i = 0; i < it->count; i ++) {
        ecs_entity_t e = it->entities[i];
        ecs_set_component_actions_w_entity(world, e, &cl[i]);   
    }
}